

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_int16(coda_cursor *cursor,int16_t *dst)

{
  int iVar1;
  char *pcVar2;
  byte local_26;
  char local_25;
  coda_native_type local_24;
  uint8_t value_1;
  int8_t value;
  ushort *puStack_20;
  coda_native_type read_type;
  int16_t *dst_local;
  coda_cursor *cursor_local;
  
  puStack_20 = (ushort *)dst;
  dst_local = (int16_t *)cursor;
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x74d);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (int16_t *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x752);
    cursor_local._4_4_ = -1;
  }
  else {
    iVar1 = get_read_type(cursor,&local_24);
    if (iVar1 == 0) {
      if (local_24 == coda_native_type_int8) {
        iVar1 = read_int8((coda_cursor *)dst_local,&local_25);
        if (iVar1 != 0) {
          return -1;
        }
        *puStack_20 = (short)local_25;
      }
      else if (local_24 == coda_native_type_uint8) {
        iVar1 = read_uint8((coda_cursor *)dst_local,&local_26);
        if (iVar1 != 0) {
          return -1;
        }
        *puStack_20 = (ushort)local_26;
      }
      else {
        if (local_24 != coda_native_type_int16) {
          pcVar2 = coda_type_get_native_type_name(local_24);
          coda_set_error(-0x69,"can not read %s data using a int16 data type",pcVar2);
          return -1;
        }
        iVar1 = read_int16((coda_cursor *)dst_local,(int16_t *)puStack_20);
        if (iVar1 != 0) {
          return -1;
        }
      }
      cursor_local._4_4_ = 0;
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_int16(const coda_cursor *cursor, int16_t *dst)
{
    coda_native_type read_type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_read_type(cursor, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            {
                int8_t value;

                if (read_int8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (int16_t)value;
            }
            break;
        case coda_native_type_uint8:
            {
                uint8_t value;

                if (read_uint8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (int16_t)value;
            }
            break;
        case coda_native_type_int16:
            if (read_int16(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a int16 data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}